

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int ChooseLeaf(Rtree *pRtree,RtreeCell *pCell,int iHeight,RtreeNode **ppLeaf)

{
  ushort uVar1;
  double dVar2;
  int iVar3;
  RtreeNode *pParent;
  uint iCell;
  int iVar4;
  RtreeDValue RVar5;
  RtreeDValue RVar6;
  double dVar7;
  i64 local_d0;
  double local_c8;
  RtreeNode *local_a0;
  RtreeNode *pChild;
  RtreeCoord aRStack_90 [2];
  RtreeCoord local_88 [2];
  RtreeCoord aRStack_80 [2];
  RtreeCoord local_78 [2];
  RtreeCoord aRStack_70 [4];
  RtreeCell cell;
  
  local_a0 = (RtreeNode *)0x0;
  iVar3 = nodeAcquire(pRtree,1,(RtreeNode *)0x0,&local_a0);
  pParent = local_a0;
  for (iVar4 = 0; (iVar3 == 0 && (iVar4 < pRtree->iDepth - iHeight)); iVar4 = iVar4 + 1) {
    uVar1 = *(ushort *)(pParent->zData + 2);
    local_d0 = 0;
    dVar2 = 0.0;
    local_c8 = 0.0;
    for (iCell = 0; (ushort)(uVar1 << 8 | uVar1 >> 8) != iCell; iCell = iCell + 1) {
      nodeGetCell(pRtree,pParent,iCell,&cell);
      local_78[0] = cell.aCoord[6];
      local_78[1] = cell.aCoord[7];
      aRStack_70[0] = cell.aCoord[8];
      aRStack_70[1] = cell.aCoord[9];
      local_88[0] = cell.aCoord[2];
      local_88[1] = cell.aCoord[3];
      aRStack_80[0] = cell.aCoord[4];
      aRStack_80[1] = cell.aCoord[5];
      pChild = (RtreeNode *)cell.iRowid;
      aRStack_90[0] = cell.aCoord[0];
      aRStack_90[1] = cell.aCoord[1];
      RVar5 = cellArea(pRtree,(RtreeCell *)&pChild);
      cellUnion(pRtree,(RtreeCell *)&pChild,pCell);
      RVar6 = cellArea(pRtree,(RtreeCell *)&pChild);
      dVar7 = RVar6 - RVar5;
      RVar5 = cellArea(pRtree,&cell);
      if (((iCell == 0) || (dVar7 < dVar2)) ||
         ((dVar7 == dVar2 && ((!NAN(dVar7) && !NAN(dVar2) && (RVar5 < local_c8)))))) {
        local_d0 = cell.iRowid;
        local_c8 = RVar5;
        dVar2 = dVar7;
      }
    }
    iVar3 = nodeAcquire(pRtree,local_d0,pParent,&pChild);
    nodeRelease(pRtree,pParent);
    pParent = pChild;
  }
  *ppLeaf = pParent;
  return iVar3;
}

Assistant:

static int ChooseLeaf(
  Rtree *pRtree,               /* Rtree table */
  RtreeCell *pCell,            /* Cell to insert into rtree */
  int iHeight,                 /* Height of sub-tree rooted at pCell */
  RtreeNode **ppLeaf           /* OUT: Selected leaf page */
){
  int rc;
  int ii;
  RtreeNode *pNode = 0;
  rc = nodeAcquire(pRtree, 1, 0, &pNode);

  for(ii=0; rc==SQLITE_OK && ii<(pRtree->iDepth-iHeight); ii++){
    int iCell;
    sqlite3_int64 iBest = 0;

    RtreeDValue fMinGrowth = RTREE_ZERO;
    RtreeDValue fMinArea = RTREE_ZERO;

    int nCell = NCELL(pNode);
    RtreeCell cell;
    RtreeNode *pChild;

    RtreeCell *aCell = 0;

    /* Select the child node which will be enlarged the least if pCell
    ** is inserted into it. Resolve ties by choosing the entry with
    ** the smallest area.
    */
    for(iCell=0; iCell<nCell; iCell++){
      int bBest = 0;
      RtreeDValue growth;
      RtreeDValue area;
      nodeGetCell(pRtree, pNode, iCell, &cell);
      growth = cellGrowth(pRtree, &cell, pCell);
      area = cellArea(pRtree, &cell);
      if( iCell==0||growth<fMinGrowth||(growth==fMinGrowth && area<fMinArea) ){
        bBest = 1;
      }
      if( bBest ){
        fMinGrowth = growth;
        fMinArea = area;
        iBest = cell.iRowid;
      }
    }

    sqlite3_free(aCell);
    rc = nodeAcquire(pRtree, iBest, pNode, &pChild);
    nodeRelease(pRtree, pNode);
    pNode = pChild;
  }

  *ppLeaf = pNode;
  return rc;
}